

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O2

void __thiscall QThreadData::~QThreadData(QThreadData *this)

{
  __pointer_type pQVar1;
  
  if ((AtomicType)(this->threadId).super_QBasicAtomicPointer<void>._q_value._M_b._M_p ==
      QCoreApplicationPrivate::theMainThreadId._q_value._M_b._M_p) {
    QCoreApplicationPrivate::theMainThread._q_value._M_b._M_p = (AtomicType)(__base_type)0x0;
    QCoreApplicationPrivate::theMainThreadId._q_value._M_b._M_p = (AtomicType)(__base_type)0x0;
    clearCurrentThreadData();
  }
  pQVar1 = (this->thread).super_QBasicAtomicPointer<QThread>._q_value._M_b._M_p;
  (this->thread).super_QBasicAtomicPointer<QThread>._q_value._M_b._M_p = (__pointer_type)0x0;
  if (pQVar1 != (__pointer_type)0x0) {
    (*(pQVar1->super_QObject)._vptr_QObject[4])();
  }
  clearEvents(this);
  QArrayDataPointer<void_*>::~QArrayDataPointer(&(this->tls).d);
  QPostEventList::~QPostEventList(&this->postEventList);
  QArrayDataPointer<QEventLoop_*>::~QArrayDataPointer((QArrayDataPointer<QEventLoop_*> *)this);
  return;
}

Assistant:

QThreadData::~QThreadData()
{
#if QT_CONFIG(thread)
    Q_ASSERT(_ref.loadRelaxed() == 0);
#endif

    if (threadId.loadAcquire() == QCoreApplicationPrivate::theMainThreadId.loadAcquire()) {
        QCoreApplicationPrivate::theMainThread.storeRelease(nullptr);
        QCoreApplicationPrivate::theMainThreadId.storeRelaxed(nullptr);
        QThreadData::clearCurrentThreadData();
    }

    // ~QThread() sets thread to nullptr, so if it isn't null here, it's
    // because we're being run before the main object itself. This can only
    // happen for QAdoptedThread. Note that both ~QThreadPrivate() and
    // ~QObjectPrivate() will deref this object again, but that is acceptable
    // because this destructor is still running (the _ref sub-object has not
    // been destroyed) and there's no reentrancy. The refcount will become
    // negative, but that's acceptable.
    QThread *t = thread.loadAcquire();
    thread.storeRelease(nullptr);
    delete t;

    clearEvents();

    // fprintf(stderr, "QThreadData %p destroyed\n", this);
}